

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase458::run(TestCase458 *this)

{
  StringPtr name;
  initializer_list<capnp::DynamicValue::Reader> value;
  bool bVar1;
  initializer_list<capnp::schemas::TestEnum_9c8e9318b29d9cd3> expected;
  Reader *local_3b0;
  undefined1 local_39c [20];
  StringPtr local_388;
  Builder local_378;
  ArrayPtr<const_char> local_338;
  Builder local_328;
  BuilderFor<capnp::schemas::TestEnum_9c8e9318b29d9cd3> local_2e6;
  TestEnum_9c8e9318b29d9cd3 local_2e4;
  bool local_2e1;
  undefined1 auStack_2e0 [7];
  bool _kj_shouldLog;
  Builder local_2d0;
  BuilderFor<capnp::schemas::TestEnum_9c8e9318b29d9cd3> local_28e;
  TestEnum_9c8e9318b29d9cd3 local_28c;
  DebugExpression<capnp::schemas::TestEnum_9c8e9318b29d9cd3> local_28a;
  undefined1 local_288 [8];
  DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_capnp::schemas::TestEnum_9c8e9318b29d9cd3>
  _kjCondition;
  Reader local_258;
  Reader local_210;
  iterator local_1c8;
  undefined1 local_1c0 [30];
  TestEnum_9c8e9318b29d9cd3 local_1a2;
  Reader local_1a0;
  ArrayPtr<const_char> local_158 [2];
  Schema local_138;
  undefined1 local_130 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase458 *this_local;
  
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&root.builder.dataSize,0x400,GROW_HEURISTICALLY);
  local_138.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestAllTypes>();
  MessageBuilder::initRoot<capnp::DynamicStruct,capnp::StructSchema>
            ((Builder *)local_130,(MessageBuilder *)&root.builder.dataSize,
             (StructSchema)local_138.raw);
  kj::StringPtr::StringPtr((StringPtr *)local_158,"enumField");
  local_1a2 = BAZ;
  DynamicValue::Reader::Reader<capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::DynamicEnum>
            (&local_1a0,&local_1a2);
  DynamicStruct::Builder::set((Builder *)local_130,(StringPtr)local_158[0],&local_1a0);
  DynamicValue::Reader::~Reader(&local_1a0);
  kj::StringPtr::StringPtr((StringPtr *)(local_1c0 + 8),"enumList");
  _kjCondition._30_2_ = 1;
  DynamicValue::Reader::Reader<capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::DynamicEnum>
            (&local_258,(TestEnum_9c8e9318b29d9cd3 *)&_kjCondition.field_0x1e);
  _kjCondition._28_2_ = 0;
  DynamicValue::Reader::Reader<capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::DynamicEnum>
            (&local_210,(TestEnum_9c8e9318b29d9cd3 *)&_kjCondition.field_0x1c);
  local_1c8 = &local_258;
  local_1c0._0_8_ = 2;
  value._M_len = 2;
  value._M_array = local_1c8;
  DynamicStruct::Builder::set((Builder *)local_130,(StringPtr)local_1c0._8_16_,value);
  local_3b0 = (Reader *)&local_1c8;
  do {
    local_3b0 = local_3b0 + -1;
    DynamicValue::Reader::~Reader(local_3b0);
  } while (local_3b0 != &local_258);
  local_28c = BAZ;
  local_28a = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_28c);
  kj::StringPtr::StringPtr((StringPtr *)auStack_2e0,"enumField");
  DynamicStruct::Builder::get(&local_2d0,(Builder *)local_130,(StringPtr)_auStack_2e0);
  local_28e = DynamicValue::Builder::as<capnp::schemas::TestEnum_9c8e9318b29d9cd3>(&local_2d0);
  kj::_::DebugExpression<capnp::schemas::TestEnum_9c8e9318b29d9cd3>::operator==
            ((DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_capnp::schemas::TestEnum_9c8e9318b29d9cd3>
              *)local_288,&local_28a,&local_28e);
  DynamicValue::Builder::~Builder(&local_2d0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_288);
  if (!bVar1) {
    local_2e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2e1 != false) {
      local_2e4 = BAZ;
      kj::StringPtr::StringPtr((StringPtr *)&local_338,"enumField");
      DynamicStruct::Builder::get(&local_328,(Builder *)local_130,(StringPtr)local_338);
      local_2e6 = DynamicValue::Builder::as<capnp::schemas::TestEnum_9c8e9318b29d9cd3>(&local_328);
      kj::_::Debug::
      log<char_const(&)[75],kj::_::DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::schemas::TestEnum_9c8e9318b29d9cd3>&,capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::schemas::TestEnum_9c8e9318b29d9cd3>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x1d0,ERROR,
                 "\"failed: expected \" \"(TestEnum::BAZ) == (root.get(\\\"enumField\\\").as<TestEnum>())\", _kjCondition, TestEnum::BAZ, root.get(\"enumField\").as<TestEnum>()"
                 ,(char (*) [75])
                  "failed: expected (TestEnum::BAZ) == (root.get(\"enumField\").as<TestEnum>())",
                 (DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_capnp::schemas::TestEnum_9c8e9318b29d9cd3>
                  *)local_288,&local_2e4,&local_2e6);
      DynamicValue::Builder::~Builder(&local_328);
      local_2e1 = false;
    }
  }
  kj::StringPtr::StringPtr(&local_388,"enumList");
  name.content.size_ = local_388.content.size_;
  name.content.ptr = local_388.content.ptr;
  DynamicStruct::Builder::get(&local_378,(Builder *)local_130,name);
  local_39c._0_2_ = VOID;
  local_39c._2_2_ = UNKNOWN >> 0x10;
  local_39c._4_8_ = local_39c;
  local_39c._12_8_ = 2;
  expected._M_len = local_388.content.size_;
  expected._M_array = (iterator)0x2;
  _::(anonymous_namespace)::
  checkList<capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::DynamicValue::Builder>
            ((_anonymous_namespace_ *)&local_378,(Builder *)local_39c._4_8_,expected);
  DynamicValue::Builder::~Builder(&local_378);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root.builder.dataSize);
  return;
}

Assistant:

TEST(DynamicApi, SetEnumFromNative) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<DynamicStruct>(Schema::from<TestAllTypes>());

  root.set("enumField", TestEnum::BAZ);
  root.set("enumList", {TestEnum::BAR, TestEnum::FOO});
  EXPECT_EQ(TestEnum::BAZ, root.get("enumField").as<TestEnum>());
  checkList<TestEnum>(root.get("enumList"), {TestEnum::BAR, TestEnum::FOO});
}